

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

PathCommand __thiscall
lunasvg::PathIterator::currentSegment(PathIterator *this,array<lunasvg::Point,_3UL> *points)

{
  PathCommand PVar1;
  plutovg_path_element_t *ppVar2;
  undefined4 uVar3;
  long lVar4;
  long lStack_8;
  
  ppVar2 = this->m_elements;
  lVar4 = (long)this->m_index;
  PVar1 = ppVar2[lVar4].header.command;
  switch(PVar1) {
  case MoveTo:
  case LineTo:
  case Close:
    uVar3 = *(undefined4 *)((long)ppVar2 + lVar4 * 8 + 0xc);
    points->_M_elems[0].x = (float)ppVar2[lVar4 + 1].header.command;
    lStack_8 = 4;
    break;
  case CubicTo:
    points->_M_elems[0] = (Point)ppVar2[lVar4 + 1];
    *(plutovg_path_element_t *)(points->_M_elems + 1) = this->m_elements[(long)this->m_index + 2];
    uVar3 = *(undefined4 *)((long)this->m_elements + (long)this->m_index * 8 + 0x1c);
    points->_M_elems[2].x = (float)this->m_elements[(long)this->m_index + 3].header.command;
    lStack_8 = 0x14;
    break;
  default:
    goto switchD_0010c938_default;
  }
  *(undefined4 *)((long)&points->_M_elems[0].x + lStack_8) = uVar3;
switchD_0010c938_default:
  return PVar1;
}

Assistant:

PathCommand PathIterator::currentSegment(std::array<Point, 3>& points) const
{
    auto command = m_elements[m_index].header.command;
    switch(command) {
    case PLUTOVG_PATH_COMMAND_MOVE_TO:
        points[0] = m_elements[m_index + 1].point;
        break;
    case PLUTOVG_PATH_COMMAND_LINE_TO:
        points[0] = m_elements[m_index + 1].point;
        break;
    case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        points[0] = m_elements[m_index + 1].point;
        points[1] = m_elements[m_index + 2].point;
        points[2] = m_elements[m_index + 3].point;
        break;
    case PLUTOVG_PATH_COMMAND_CLOSE:
        points[0] = m_elements[m_index + 1].point;
        break;
    }

    return PathCommand(command);
}